

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 SyStrncmp(char *zLeft,char *zRight,sxu32 nLen)

{
  byte *pbVar1;
  int iVar2;
  long lVar3;
  byte *pbVar4;
  uchar *zQ;
  uchar *zP;
  
  if (zLeft != (char *)0x0) {
    if ((zRight != (char *)0x0 && *zLeft != '\0') && (*zRight != '\0')) {
      if (nLen == 0) {
        return 0;
      }
      lVar3 = 0;
      pbVar1 = (byte *)zRight;
      pbVar4 = (byte *)zLeft;
      while (zLeft[lVar3] != '\0') {
        if (zLeft[lVar3] != zRight[lVar3]) goto LAB_00135b72;
        iVar2 = (int)lVar3;
        if (nLen - 1 == iVar2) {
          return 0;
        }
        if (zLeft[lVar3 + 1] == '\0') {
          pbVar1 = pbVar1 + 1;
          pbVar4 = pbVar4 + 1;
          goto LAB_00135b72;
        }
        if (zLeft[lVar3 + 1] != zRight[lVar3 + 1]) {
          pbVar1 = (byte *)(zRight + lVar3 + 1);
          pbVar4 = pbVar4 + 1;
          goto LAB_00135b72;
        }
        if (nLen - 2 == iVar2) {
          return 0;
        }
        if (zLeft[lVar3 + 2] == '\0') {
          pbVar1 = (byte *)(zRight + lVar3 + 2);
          pbVar4 = pbVar4 + 2;
          goto LAB_00135b72;
        }
        if (zLeft[lVar3 + 2] != zRight[lVar3 + 2]) {
          pbVar1 = pbVar1 + 2;
          pbVar4 = pbVar4 + 2;
          goto LAB_00135b72;
        }
        if (nLen - 3 == iVar2) {
          return 0;
        }
        if (zLeft[lVar3 + 3] == '\0') {
          pbVar1 = pbVar1 + 3;
          pbVar4 = pbVar4 + 3;
          goto LAB_00135b72;
        }
        if (zLeft[lVar3 + 3] != zRight[lVar3 + 3]) {
          pbVar1 = (byte *)(zRight + lVar3 + 3);
          pbVar4 = pbVar4 + 3;
          goto LAB_00135b72;
        }
        pbVar4 = pbVar4 + 4;
        pbVar1 = pbVar1 + 4;
        lVar3 = lVar3 + 4;
        if (nLen == (sxu32)lVar3) {
          return 0;
        }
      }
      pbVar1 = (byte *)(zRight + lVar3);
      pbVar4 = (byte *)(zLeft + lVar3);
LAB_00135b72:
      return (uint)*pbVar4 - (uint)*pbVar1;
    }
    if (*zLeft != '\0') {
      return 1;
    }
  }
  if (zRight == (char *)0x0) {
    return 0;
  }
  return -(uint)(*zRight != '\0');
}

Assistant:

JX9_PRIVATE sxi32 SyStrncmp(const char *zLeft, const char *zRight, sxu32 nLen)
{
	const unsigned char *zP = (const unsigned char *)zLeft;
	const unsigned char *zQ = (const unsigned char *)zRight;

	if( SX_EMPTY_STR(zP) || SX_EMPTY_STR(zQ)  ){
			return SX_EMPTY_STR(zP) ? (SX_EMPTY_STR(zQ) ? 0 : -1) :1;
	}
	if( nLen <= 0 ){
		return 0;
	}
	for(;;){
		if( nLen <= 0 ){ return 0; } if( zP[0] == 0 || zQ[0] == 0 || zP[0] != zQ[0] ){ break; } zP++; zQ++; nLen--;
		if( nLen <= 0 ){ return 0; } if( zP[0] == 0 || zQ[0] == 0 || zP[0] != zQ[0] ){ break; } zP++; zQ++; nLen--;
		if( nLen <= 0 ){ return 0; } if( zP[0] == 0 || zQ[0] == 0 || zP[0] != zQ[0] ){ break; } zP++; zQ++; nLen--;
		if( nLen <= 0 ){ return 0; } if( zP[0] == 0 || zQ[0] == 0 || zP[0] != zQ[0] ){ break; } zP++; zQ++; nLen--;
	}
	return (sxi32)(zP[0] - zQ[0]);
}